

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_core.c
# Opt level: O0

int provider_activate_fallbacks(provider_store_st *store)

{
  int iVar1;
  uint uVar2;
  OSSL_PROVIDER *prov_00;
  provider_store_st *in_RDI;
  OSSL_PROVIDER *prov;
  OSSL_PROVIDER_INFO *p;
  int ret;
  int activated_fallback_count;
  int use_fallbacks;
  OSSL_PROVIDER *in_stack_ffffffffffffffc8;
  OSSL_PROVIDER_INFO *name;
  int in_stack_ffffffffffffffe0;
  int iVar3;
  int local_4;
  
  iVar3 = 0;
  local_4 = 0;
  iVar1 = CRYPTO_THREAD_read_lock(in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    uVar2 = (uint)(in_RDI->field_0x48 & 1);
    CRYPTO_THREAD_unlock(in_stack_ffffffffffffffc8);
    if (uVar2 == 0) {
      local_4 = 1;
    }
    else {
      iVar1 = CRYPTO_THREAD_write_lock(in_stack_ffffffffffffffc8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        uVar2 = (uint)(in_RDI->field_0x48 & 1);
        if (uVar2 == 0) {
          CRYPTO_THREAD_unlock(in_stack_ffffffffffffffc8);
          local_4 = 1;
        }
        else {
          for (name = ossl_predefined_providers; name->name != (char *)0x0; name = name + 1) {
            if ((name->field_0x20 & 1) != 0) {
              prov_00 = provider_new((char *)name,(OSSL_provider_init_fn *)0x0,
                                     (stack_st_INFOPAIR *)in_stack_ffffffffffffffc8);
              if (prov_00 == (OSSL_PROVIDER *)0x0) goto LAB_00293437;
              prov_00->libctx = in_RDI->libctx;
              iVar1 = ERR_get_next_error_library();
              prov_00->error_lib = iVar1;
              iVar1 = provider_activate((OSSL_PROVIDER *)CONCAT44(uVar2,iVar3),local_4,
                                        in_stack_ffffffffffffffe0);
              if (iVar1 < 0) {
                ossl_provider_free(prov_00);
                goto LAB_00293437;
              }
              prov_00->store = in_RDI;
              iVar1 = sk_OSSL_PROVIDER_push
                                ((stack_st_OSSL_PROVIDER *)prov_00,in_stack_ffffffffffffffc8);
              if (iVar1 == 0) {
                ossl_provider_free(prov_00);
                goto LAB_00293437;
              }
              iVar3 = iVar3 + 1;
            }
          }
          if (0 < iVar3) {
            in_RDI->field_0x48 = in_RDI->field_0x48 & 0xfe;
            local_4 = 1;
          }
LAB_00293437:
          CRYPTO_THREAD_unlock(in_stack_ffffffffffffffc8);
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int provider_activate_fallbacks(struct provider_store_st *store)
{
    int use_fallbacks;
    int activated_fallback_count = 0;
    int ret = 0;
    const OSSL_PROVIDER_INFO *p;

    if (!CRYPTO_THREAD_read_lock(store->lock))
        return 0;
    use_fallbacks = store->use_fallbacks;
    CRYPTO_THREAD_unlock(store->lock);
    if (!use_fallbacks)
        return 1;

    if (!CRYPTO_THREAD_write_lock(store->lock))
        return 0;
    /* Check again, just in case another thread changed it */
    use_fallbacks = store->use_fallbacks;
    if (!use_fallbacks) {
        CRYPTO_THREAD_unlock(store->lock);
        return 1;
    }

    for (p = ossl_predefined_providers; p->name != NULL; p++) {
        OSSL_PROVIDER *prov = NULL;

        if (!p->is_fallback)
            continue;
        /*
         * We use the internal constructor directly here,
         * otherwise we get a call loop
         */
        prov = provider_new(p->name, p->init, NULL);
        if (prov == NULL)
            goto err;
        prov->libctx = store->libctx;
#ifndef FIPS_MODULE
        prov->error_lib = ERR_get_next_error_library();
#endif

        /*
         * We are calling provider_activate while holding the store lock. This
         * means the init function will be called while holding a lock. Normally
         * we try to avoid calling a user callback while holding a lock.
         * However, fallbacks are never third party providers so we accept this.
         */
        if (provider_activate(prov, 0, 0) < 0) {
            ossl_provider_free(prov);
            goto err;
        }
        prov->store = store;
        if (sk_OSSL_PROVIDER_push(store->providers, prov) == 0) {
            ossl_provider_free(prov);
            goto err;
        }
        activated_fallback_count++;
    }

    if (activated_fallback_count > 0) {
        store->use_fallbacks = 0;
        ret = 1;
    }
 err:
    CRYPTO_THREAD_unlock(store->lock);
    return ret;
}